

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_fwd.hpp
# Opt level: O1

void __thiscall
toml::source_location::source_location(source_location *this,source_location *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  pointer pbVar11;
  bool bVar12;
  undefined7 uVar13;
  
  bVar12 = param_2->is_ok_;
  uVar13 = *(undefined7 *)&param_2->field_0x1;
  sVar4 = param_2->first_line_;
  sVar5 = param_2->first_column_;
  sVar6 = param_2->first_offset_;
  sVar7 = param_2->last_line_;
  sVar8 = param_2->last_column_;
  sVar9 = param_2->length_;
  this->last_offset_ = param_2->last_offset_;
  this->length_ = sVar9;
  this->last_line_ = sVar7;
  this->last_column_ = sVar8;
  this->first_column_ = sVar5;
  this->first_offset_ = sVar6;
  this->is_ok_ = bVar12;
  *(undefined7 *)&this->field_0x1 = uVar13;
  this->first_line_ = sVar4;
  paVar1 = &(this->file_name_).field_2;
  (this->file_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->file_name_)._M_dataplus._M_p;
  paVar2 = &(param_2->file_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar10 = *(undefined8 *)((long)&(param_2->file_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->file_name_).field_2 + 8) = uVar10;
  }
  else {
    (this->file_name_)._M_dataplus._M_p = pcVar3;
    (this->file_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->file_name_)._M_string_length = (param_2->file_name_)._M_string_length;
  (param_2->file_name_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->file_name_)._M_string_length = 0;
  (param_2->file_name_).field_2._M_local_buf[0] = '\0';
  pbVar11 = (param_2->line_str_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (this->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->line_str_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
  (this->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->line_str_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

source_location(source_location &&)     = default;